

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

void luaL_checkversion_(lua_State *L,lua_Number ver,size_t sz)

{
  lua_Number *plVar1;
  lua_Number *plVar2;
  
  plVar1 = lua_version(L);
  if (sz != 0x88) {
    luaL_error(L,"core and library have incompatible numeric types");
  }
  plVar2 = lua_version((lua_State *)0x0);
  if (plVar1 != plVar2) {
    luaL_error(L,"multiple Lua VMs detected");
    return;
  }
  if ((*plVar1 == ver) && (!NAN(*plVar1) && !NAN(ver))) {
    return;
  }
  luaL_error(L,"version mismatch: app. needs %f, Lua core provides %f");
  return;
}

Assistant:

LUALIB_API void luaL_checkversion_ (lua_State *L, lua_Number ver, size_t sz) {
  const lua_Number *v = lua_version(L);
  if (sz != LUAL_NUMSIZES)  /* check numeric types */
    luaL_error(L, "core and library have incompatible numeric types");
  if (v != lua_version(NULL))
    luaL_error(L, "multiple Lua VMs detected");
  else if (*v != ver)
    luaL_error(L, "version mismatch: app. needs %f, Lua core provides %f",
                  (LUAI_UACNUMBER)ver, (LUAI_UACNUMBER)*v);
}